

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_structs.c
# Opt level: O0

void internal_exr_destroy_context(exr_context_t ctxt)

{
  exr_context_t in_RDI;
  exr_context_t unaff_retaddr;
  exr_memory_free_func_t dofree;
  exr_context_t in_stack_00000018;
  exr_attr_string_t *s;
  
  s = (exr_attr_string_t *)in_RDI->free_fn;
  exr_attr_string_destroy(in_RDI,s);
  exr_attr_string_destroy(in_RDI,s);
  exr_attr_list_destroy(in_stack_00000018,(exr_attribute_list_t *)ctxt);
  internal_exr_destroy_parts(unaff_retaddr);
  pthread_mutex_destroy((pthread_mutex_t *)&in_RDI->mutex);
  (*(code *)s)(in_RDI);
  return;
}

Assistant:

void
internal_exr_destroy_context (exr_context_t ctxt)
{
    exr_memory_free_func_t dofree = ctxt->free_fn;

    exr_attr_string_destroy (ctxt, &(ctxt->filename));
    exr_attr_string_destroy (ctxt, &(ctxt->tmp_filename));
    exr_attr_list_destroy (ctxt, &(ctxt->custom_handlers));
    internal_exr_destroy_parts (ctxt);
#ifdef ILMTHREAD_THREADING_ENABLED
#    ifdef _WIN32
    DeleteCriticalSection (&(ctxt->mutex));
#    else
    pthread_mutex_destroy (&(ctxt->mutex));
#    endif
#endif

    dofree (ctxt);
}